

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::PushComment(XMLPrinter *this,char *comment)

{
  char *comment_local;
  XMLPrinter *this_local;
  
  SealElementIfJustOpened(this);
  if (((this->_textDepth < 0) && ((this->_firstElement & 1U) == 0)) &&
     ((this->_compactMode & 1U) == 0)) {
    Putc(this,'\n');
    (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xc])(this,(ulong)(uint)this->_depth);
  }
  this->_firstElement = false;
  Write(this,"<!--");
  Write(this,comment);
  Write(this,"-->");
  return;
}

Assistant:

void XMLPrinter::PushComment(const char* comment)
{
    SealElementIfJustOpened();
    if (_textDepth < 0 && !_firstElement && !_compactMode) {
        Putc('\n');
        PrintSpace(_depth);
    }
    _firstElement = false;

    Write("<!--");
    Write(comment);
    Write("-->");
}